

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int jumponcond(FuncState *fs,expdesc *e,int cond)

{
  int iVar1;
  uint uVar2;
  
  if ((e->k == VRELOCABLE) && (uVar2 = fs->f->code[(e->u).s.info], (uVar2 & 0x3f) == 0x13)) {
    fs->pc = fs->pc + -1;
    uVar2 = (uint)(cond == 0) << 0xe | uVar2 >> 0x11 & 0xffffffc0 | 0x1a;
    iVar1 = fs->ls->lastline;
  }
  else {
    discharge2anyreg(fs,e);
    if ((e->k == VNONRELOC) &&
       ((uVar2 = (e->u).s.info, (uVar2 >> 8 & 1) == 0 && ((int)(uint)fs->nactvar <= (int)uVar2)))) {
      fs->freereg = fs->freereg + -1;
    }
    uVar2 = cond << 0xe | (e->u).s.info << 0x17 | 0x3fdb;
    iVar1 = fs->ls->lastline;
  }
  luaK_code(fs,uVar2,iVar1);
  iVar1 = luaK_jump(fs);
  return iVar1;
}

Assistant:

static int jumponcond(FuncState*fs,expdesc*e,int cond){
if(e->k==VRELOCABLE){
Instruction ie=getcode(fs,e);
if(GET_OPCODE(ie)==OP_NOT){
fs->pc--;
return condjump(fs,OP_TEST,GETARG_B(ie),0,!cond);
}
}
discharge2anyreg(fs,e);
freeexp(fs,e);
return condjump(fs,OP_TESTSET,((1<<8)-1),e->u.s.info,cond);
}